

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::BrokerBase::generateCLI(BrokerBase *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::helicsCLI11App> sVar1;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[31]>((char (*) [31])this);
  helicsCLI11App::remove_helics_specifics((helicsCLI11App *)this->_vptr_BrokerBase);
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> BrokerBase::generateCLI()
{
    auto hApp = std::make_shared<helicsCLI11App>("Core/Broker specific arguments");
    hApp->remove_helics_specifics();
    return hApp;
}